

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

Question *
kj::_::
CopyConstructArray_<capnp::_::RpcSystemBase::RpcConnectionState::Question,_capnp::_::RpcSystemBase::RpcConnectionState::Question_*,_true,_false>
::apply(Question *pos,Question *start,Question *end)

{
  bool bVar1;
  ExceptionGuard local_18;
  
  if (start != end) {
    do {
      (pos->paramExports).ptr = (start->paramExports).ptr;
      (pos->paramExports).size_ = (start->paramExports).size_;
      (start->paramExports).ptr = (uint *)0x0;
      (start->paramExports).size_ = 0;
      (pos->paramExports).disposer = (start->paramExports).disposer;
      (pos->selfRef).ptr = (start->selfRef).ptr;
      (start->selfRef).ptr = (QuestionRef *)0x0;
      pos->skipFinish = start->skipFinish;
      bVar1 = start->isTailCall;
      pos->isAwaitingReturn = start->isAwaitingReturn;
      pos->isTailCall = bVar1;
      start = start + 1;
      pos = pos + 1;
    } while (start != end);
  }
  local_18.start = pos;
  local_18.pos = pos;
  ExceptionGuard::~ExceptionGuard(&local_18);
  return pos;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) (void)implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }